

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btAlignedObjectArray<int>_>::btAlignedObjectArray
          (btAlignedObjectArray<btAlignedObjectArray<int>_> *this,
          btAlignedObjectArray<btAlignedObjectArray<int>_> *otherArray)

{
  uint newsize;
  btAlignedObjectArray<int> bStack_38;
  
  this->m_ownsMemory = true;
  this->m_data = (btAlignedObjectArray<int> *)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  newsize = otherArray->m_size;
  bStack_38.m_ownsMemory = true;
  bStack_38.m_data = (int *)0x0;
  bStack_38.m_size = 0;
  bStack_38.m_capacity = 0;
  resize(this,newsize,&bStack_38);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&bStack_38);
  copy(otherArray,(EVP_PKEY_CTX *)0x0,(EVP_PKEY_CTX *)(ulong)newsize);
  return;
}

Assistant:

btAlignedObjectArray(const btAlignedObjectArray& otherArray)
		{
			init();

			int otherSize = otherArray.size();
			resize (otherSize);
			otherArray.copy(0, otherSize, m_data);
		}